

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int __thiscall AActor::CallDoSpecialDamage(AActor *this,AActor *target,int damage,FName *damagetype)

{
  uint uVar1;
  int v;
  MetaClass *pMVar2;
  VMFunction **ppVVar3;
  VMFrameStack *this_00;
  VMValue *local_e8;
  VMFunction *local_d0;
  FName local_b8;
  int local_b4;
  undefined1 local_b0 [4];
  int retval;
  VMReturn ret;
  undefined1 local_88 [8];
  VMValue params [4];
  VMFunction *func;
  MetaClass *clss;
  FName *damagetype_local;
  int damage_local;
  AActor *target_local;
  AActor *this_local;
  
  if ((CallDoSpecialDamage::VIndex == 0xffffffff) &&
     (CallDoSpecialDamage::VIndex = GetVirtualIndex(RegistrationInfo.MyClass,"DoSpecialDamage"),
     CallDoSpecialDamage::VIndex == 0xffffffff)) {
    __assert_fail("VIndex != ~0u",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1ba8,"int AActor::CallDoSpecialDamage(AActor *, int, FName)");
  }
  pMVar2 = GetClass(this);
  uVar1 = TArray<VMFunction_*,_VMFunction_*>::Size(&(pMVar2->super_PClass).Virtuals);
  if (CallDoSpecialDamage::VIndex < uVar1) {
    ppVVar3 = TArray<VMFunction_*,_VMFunction_*>::operator[]
                        (&(pMVar2->super_PClass).Virtuals,(ulong)CallDoSpecialDamage::VIndex);
    local_d0 = *ppVVar3;
  }
  else {
    local_d0 = (VMFunction *)0x0;
  }
  if (local_d0 == (VMFunction *)0x0) {
    FName::FName(&local_b8,damagetype);
    this_local._4_4_ =
         (*(this->super_DThinker).super_DObject._vptr_DObject[0x10])
                   (this,target,(ulong)(uint)damage,&local_b8);
  }
  else {
    VMValue::VMValue((VMValue *)local_88,(DObject *)this);
    VMValue::VMValue((VMValue *)((long)&params[0].field_0 + 8),(DObject *)target);
    VMValue::VMValue((VMValue *)((long)&params[1].field_0 + 8),damage);
    v = FName::GetIndex(damagetype);
    VMValue::VMValue((VMValue *)((long)&params[2].field_0 + 8),v);
    VMReturn::IntAt((VMReturn *)local_b0,&local_b4);
    this_00 = (VMFrameStack *)_ZTW13GlobalVMStack();
    VMFrameStack::Call(this_00,local_d0,(VMValue *)local_88,4,(VMReturn *)local_b0,1,
                       (VMException **)0x0);
    this_local._4_4_ = local_b4;
    local_e8 = (VMValue *)((long)&params[3].field_0 + 8);
    do {
      local_e8 = local_e8 + -1;
      VMValue::~VMValue(local_e8);
    } while (local_e8 != (VMValue *)local_88);
  }
  return this_local._4_4_;
}

Assistant:

int AActor::CallDoSpecialDamage(AActor *target, int damage, FName damagetype)
{
	IFVIRTUAL(AActor, DoSpecialDamage)
	{
		// Without the type cast this picks the 'void *' assignment...
		VMValue params[4] = { (DObject*)this, (DObject*)target, damage, damagetype.GetIndex() };
		VMReturn ret;
		int retval;
		ret.IntAt(&retval);
		GlobalVMStack.Call(func, params, 4, &ret, 1, nullptr);
		return retval;
	}
	else return DoSpecialDamage(target, damage, damagetype);

}